

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O2

void __thiscall HACD::HACD::InitializeDualGraph(HACD *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  Vec3<long> *pVVar6;
  Vec3<double> *pVVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  Vec3<double> *pVVar18;
  ICHUll *this_00;
  double dVar19;
  undefined1 *puVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  size_t v;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 *puVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM6 [16];
  ulong local_5a0;
  undefined1 local_598 [24];
  undefined1 *local_580;
  ulong local_578;
  ulong local_570;
  undefined1 local_568 [16];
  double local_558;
  undefined1 *local_548;
  long local_540;
  long local_538;
  long local_530;
  long local_528;
  ulong local_520;
  ulong local_518;
  long hitTriangle;
  undefined8 local_508;
  undefined8 uStack_500;
  DPoint local_4f0;
  Vec3<double> hitNormal;
  Vec3<double> hitPoint;
  Float dist;
  RaycastMesh rm;
  char msg [1024];
  
  pVVar18 = this->m_normals;
  if (pVVar18 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar18[-1].m_data + 2,(long)pVVar18[-1].m_data[2] * 0x18 + 8);
  }
  uVar26 = this->m_nPoints;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar26;
  uVar15 = SUB168(auVar28 * ZEXT816(0x18),0);
  uVar22 = 0xffffffffffffffff;
  uVar17 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar17 = uVar22;
  }
  if (SUB168(auVar28 * ZEXT816(0x18),8) != 0) {
    uVar17 = uVar22;
  }
  puVar16 = (ulong *)operator_new__(uVar17);
  *puVar16 = uVar26;
  pVVar18 = (Vec3<double> *)(puVar16 + 1);
  this->m_normals = pVVar18;
  if (this->m_addFacesPoints == true) {
    pVVar18 = this->m_facePoints;
    if (pVVar18 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar18[-1].m_data + 2,(long)pVVar18[-1].m_data[2] * 0x18 + 8);
    }
    pVVar18 = this->m_faceNormals;
    if (pVVar18 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar18[-1].m_data + 2,(long)pVVar18[-1].m_data[2] * 0x18 + 8);
    }
    uVar26 = this->m_nTriangles;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar26;
    uVar15 = SUB168(auVar8 * ZEXT816(0x18),0);
    uVar17 = uVar15 + 8;
    if (0xfffffffffffffff7 < uVar15) {
      uVar17 = 0xffffffffffffffff;
    }
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
      uVar15 = uVar17;
    }
    puVar16 = (ulong *)operator_new__(uVar15);
    *puVar16 = uVar26;
    this->m_facePoints = (Vec3<double> *)(puVar16 + 1);
    puVar16 = (ulong *)operator_new__(uVar15);
    *puVar16 = uVar26;
    this->m_faceNormals = (Vec3<double> *)(puVar16 + 1);
    pVVar18 = this->m_normals;
    uVar26 = this->m_nPoints;
  }
  memset(pVVar18,0,uVar26 * 0x18);
  RaycastMesh::RaycastMesh(&rm);
  if (this->m_addExtraDistPoints == true) {
    RaycastMesh::Initialize
              (&rm,this->m_nPoints,this->m_nTriangles,this->m_points,this->m_triangles,0xf,4,2.0);
    uVar26 = this->m_nTriangles;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar26;
    uVar15 = SUB168(auVar9 * ZEXT816(0x18),0);
    uVar17 = uVar15 + 8;
    if (0xfffffffffffffff7 < uVar15) {
      uVar17 = 0xffffffffffffffff;
    }
    if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    puVar16 = (ulong *)operator_new__(uVar17);
    *puVar16 = uVar26;
    this->m_extraDistPoints = (Vec3<double> *)(puVar16 + 1);
    puVar16 = (ulong *)operator_new__(uVar17);
    *puVar16 = uVar26;
    this->m_extraDistNormals = (Vec3<double> *)(puVar16 + 1);
  }
  this->m_area = 0.0;
  puVar20 = (undefined1 *)0x278;
  local_548 = &DAT_bff0000000000000;
  lVar25 = 0x10;
  local_508 = 0x4008000000000000;
  uStack_500 = 0x4008000000000000;
  uVar26 = 0;
  while (uVar26 < this->m_nTriangles) {
    auVar28 = vcvtusi2sd_avx512f(in_XMM6,uVar26);
    auVar8 = vcvtusi2sd_avx512f(in_XMM6,this->m_nTriangles);
    puVar29 = (undefined1 *)((auVar28._0_8_ * 100.0) / auVar8._0_8_);
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (double)puVar29 - (double)local_548;
    auVar28 = vandpd_avx512vl(auVar34,auVar11);
    local_518 = uVar22;
    if ((1.0 < auVar28._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
      sprintf(msg,"%3.2f %% \t \t \r");
      (*this->m_callBack)(msg,(double)puVar29,0.0,this->m_nTriangles);
      local_548 = puVar29;
    }
    pVVar6 = this->m_triangles;
    local_578 = *(ulong *)((long)pVVar6->m_data + lVar25 + -0x10);
    uVar22 = *(ulong *)((long)pVVar6->m_data + lVar25 + -8);
    local_5a0 = *(ulong *)((long)pVVar6->m_data + lVar25);
    local_598._8_8_ = 0;
    local_598._0_8_ = local_578;
    local_598._16_8_ = local_598._16_8_ & 0xffffffffffff0000;
    SArray<HACD::DPoint,_16UL>::PushBack
              ((SArray<HACD::DPoint,_16UL> *)
               (puVar20 +
               (long)((long)((this->m_graph).m_vertices.
                             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_distPoints.m_data0 + 6)
                     + 8)),(DPoint *)local_598);
    local_598._8_8_ = 0;
    local_598._0_8_ = uVar22;
    local_598._16_8_ = local_598._16_8_ & 0xffffffffffff0000;
    local_570 = uVar22;
    SArray<HACD::DPoint,_16UL>::PushBack
              ((SArray<HACD::DPoint,_16UL> *)
               (puVar20 +
               (long)((long)((this->m_graph).m_vertices.
                             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_distPoints.m_data0 + 6)
                     + 8)),(DPoint *)local_598);
    local_598._8_8_ = 0;
    local_598._0_8_ = local_5a0;
    local_598._16_8_ = local_598._16_8_ & 0xffffffffffff0000;
    local_580 = puVar20;
    local_520 = uVar26;
    SArray<HACD::DPoint,_16UL>::PushBack
              ((SArray<HACD::DPoint,_16UL> *)
               (puVar20 +
               (long)((long)((this->m_graph).m_vertices.
                             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_distPoints.m_data0 + 6)
                     + 8)),(DPoint *)local_598);
    this_00 = (ICHUll *)::operator_new(0x110);
    ICHUll::ICHUll(this_00,this->m_heapManager);
    uVar26 = local_578;
    *(ICHUll **)
     (local_580 +
     (long)&(this->m_graph).m_vertices.
            super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
            super__Vector_impl_data._M_start[-1].m_boudaryEdges.m_maxSize) = this_00;
    lVar21 = local_578 * 0x18;
    ICHUll::AddPoint(this_00,this->m_points + local_578,local_578);
    local_540 = local_570 * 0x18;
    ICHUll::AddPoint(this_00,this->m_points + local_570,local_570);
    ICHUll::AddPoint(this_00,this->m_points + local_5a0,local_5a0);
    lVar24 = local_540;
    this_00->m_distPoints =
         (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
          *)0x0;
    pVVar18 = this->m_points;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = pVVar18[uVar26].m_data[0];
    auVar44._8_8_ = pVVar18[uVar26].m_data[2];
    auVar44._0_8_ = pVVar18[uVar26].m_data[2];
    auVar8 = vsubpd_avx(*(undefined1 (*) [16])((long)pVVar18->m_data + local_540 + 8),
                        *(undefined1 (*) [16])(pVVar18[uVar26].m_data + 1));
    dVar19 = pVVar18[local_5a0].m_data[1] -
             SUB168(*(undefined1 (*) [16])(pVVar18[uVar26].m_data + 1),0);
    in_ZMM2 = ZEXT864((ulong)dVar19);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pVVar18[local_5a0].m_data[2];
    auVar9 = vunpcklpd_avx(auVar44,auVar35);
    auVar28 = vmovhpd_avx(auVar42,pVVar18[local_5a0].m_data[0]);
    auVar9 = vsubpd_avx(auVar28,auVar9);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(double *)((long)pVVar18->m_data + local_540) - pVVar18[uVar26].m_data[0];
    auVar28 = vshufpd_avx(auVar8,auVar30,1);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar19;
    auVar10 = vunpcklpd_avx(auVar41,auVar9);
    auVar43._0_8_ = auVar10._0_8_ * auVar28._0_8_;
    auVar43._8_8_ = auVar10._8_8_ * auVar28._8_8_;
    local_568 = vfmsub231pd_fma(auVar43,auVar8,auVar9);
    auVar28 = vshufpd_avx(auVar9,auVar9,1);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auVar28._0_8_ * auVar8._0_8_;
    auVar28 = vfmsub231sd_fma(auVar36,auVar30,auVar41);
    local_558 = auVar28._0_8_;
    Vec3<double>::operator+=(this->m_normals + uVar26,(Vec3<double> *)local_568);
    Vec3<double>::operator+=
              ((Vec3<double> *)((long)this->m_normals->m_data + lVar24),(Vec3<double> *)local_568);
    Vec3<double>::operator+=(this->m_normals + local_5a0,(Vec3<double> *)local_568);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_568._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (double)local_568._8_8_ * (double)local_568._8_8_;
    auVar28 = vfmadd231sd_fma(auVar37,auVar31,auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_558;
    auVar28 = vfmadd213sd_fma(auVar32,auVar32,auVar28);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    *(double *)
     (local_580 +
     (long)&(this->m_graph).m_vertices.
            super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
            super__Vector_impl_data._M_start[-1].m_boudaryEdges.m_size) = auVar28._0_8_;
    this->m_area = auVar28._0_8_ + this->m_area;
    Vec3<double>::Normalize((Vec3<double> *)local_568);
    uVar26 = local_570;
    puVar20 = local_580;
    lVar27 = local_578 << 0x20;
    lVar24 = local_570 << 0x20;
    dVar19 = (double)(lVar24 + local_578);
    if (local_570 < local_578) {
      dVar19 = (double)(lVar27 + local_570);
    }
    local_538 = lVar21;
    local_530 = local_5a0 * 0x18;
    local_528 = lVar25;
    local_598._0_8_ = dVar19;
    SArray<unsigned_long_long,_16UL>::Insert
              ((SArray<unsigned_long_long,_16UL> *)
               (local_580 +
               (long)(this->m_graph).m_vertices.
                     super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                     _M_impl.super__Vector_impl_data._M_start),(unsigned_long_long *)local_598);
    local_598._0_8_ = (local_5a0 << 0x20) + uVar26;
    if (local_5a0 < uVar26) {
      local_598._0_8_ = lVar24 + local_5a0;
    }
    SArray<unsigned_long_long,_16UL>::Insert
              ((SArray<unsigned_long_long,_16UL> *)
               (puVar20 +
               (long)(this->m_graph).m_vertices.
                     super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                     _M_impl.super__Vector_impl_data._M_start),(unsigned_long_long *)local_598);
    local_598._0_8_ = lVar27 + local_5a0;
    if (local_578 < local_5a0) {
      local_598._0_8_ = (local_5a0 << 0x20) + local_578;
    }
    SArray<unsigned_long_long,_16UL>::Insert
              ((SArray<unsigned_long_long,_16UL> *)
               (puVar20 +
               (long)(this->m_graph).m_vertices.
                     super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                     _M_impl.super__Vector_impl_data._M_start),(unsigned_long_long *)local_598);
    uVar22 = local_518;
    lVar25 = local_528;
    if (this->m_addFacesPoints == true) {
      pVVar18 = this->m_faceNormals;
      *(undefined8 *)((long)pVVar18->m_data + local_528 + -0x10) = local_568._0_8_;
      *(undefined8 *)((long)pVVar18->m_data + local_528 + -8) = local_568._8_8_;
      *(double *)((long)pVVar18->m_data + local_528) = local_558;
      pVVar18 = this->m_points;
      pVVar7 = this->m_facePoints;
      dVar19 = *(double *)((long)pVVar18->m_data + local_538 + 0x10);
      pdVar1 = (double *)((long)pVVar18->m_data + local_538);
      dVar4 = *(double *)((long)pVVar18->m_data + local_540 + 0x10);
      pdVar2 = (double *)((long)pVVar18->m_data + local_540);
      dVar5 = *(double *)((long)pVVar18->m_data + local_530 + 0x10);
      pdVar3 = (double *)((long)pVVar18->m_data + local_530);
      auVar38._0_8_ = *pdVar1 + *pdVar2 + *pdVar3;
      auVar38._8_8_ = pdVar1[1] + pdVar2[1] + pdVar3[1];
      auVar13._8_8_ = uStack_500;
      auVar13._0_8_ = local_508;
      auVar28 = vdivpd_avx(auVar38,auVar13);
      *(undefined1 (*) [16])((long)pVVar7->m_data + local_528 + -0x10) = auVar28;
      *(double *)((long)pVVar7->m_data + local_528) = (dVar19 + dVar4 + dVar5) / 3.0;
      local_598._8_8_ = 0;
      local_598._0_8_ = local_518;
      local_598._16_2_ = 0x100;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 (puVar20 +
                 (long)((long)((this->m_graph).m_vertices.
                               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_distPoints.m_data0 +
                              6) + 8)),(DPoint *)local_598);
    }
    puVar20 = puVar20 + 0x310;
    uVar22 = uVar22 - 1;
    lVar25 = lVar25 + 0x18;
    uVar26 = local_520 + 1;
  }
  if (this->m_addExtraDistPoints != false) {
    if (this->m_callBack != (CallBackFunction)0x0) {
      (*this->m_callBack)("++ Also adding distance points\n",0.0,0.0,0);
    }
    local_580 = &DAT_bff0000000000000;
    lVar25 = 0x10;
    local_578 = local_578 * 0x18;
    local_570 = local_570 * 0x18;
    lVar24 = 200;
    lVar21 = 0;
    while (sVar23 = this->m_nTriangles, lVar21 < (long)sVar23) {
      pVVar18 = this->m_points;
      pdVar1 = (double *)((long)pVVar18->m_data + local_578);
      pdVar2 = (double *)((long)pVVar18->m_data + local_570);
      auVar39._0_8_ = *pdVar1 + *pdVar2 + pVVar18[local_5a0].m_data[0];
      auVar39._8_8_ = pdVar1[1] + pdVar2[1] + pVVar18[local_5a0].m_data[1];
      auVar10._8_8_ = uStack_500;
      auVar10._0_8_ = local_508;
      local_598._0_16_ = vdivpd_avx(auVar39,auVar10);
      local_598._16_8_ =
           (*(double *)((long)pVVar18->m_data + local_578 + 0x10) +
            *(double *)((long)pVVar18->m_data + local_570 + 0x10) + pVVar18[local_5a0].m_data[2]) /
           3.0;
      auVar33._0_8_ = -local_558;
      auVar33._8_8_ = 0x8000000000000000;
      local_568._8_8_ = -(double)local_568._8_8_;
      local_568._0_8_ = -(double)local_568._0_8_;
      local_558 = (double)vmovlpd_avx(auVar33);
      bVar14 = RaycastMesh::Raycast
                         (&rm,(Vec3<double> *)local_598,(Vec3<double> *)local_568,&hitTriangle,&dist
                          ,&hitPoint,&hitNormal);
      if (bVar14) {
        sVar23 = hitTriangle;
      }
      uVar26 = this->m_nTriangles;
      if (sVar23 < uVar26) {
        pVVar18 = this->m_extraDistPoints;
        *(double *)((long)pVVar18->m_data + lVar25 + -0x10) = hitPoint.m_data[0];
        *(double *)((long)pVVar18->m_data + lVar25 + -8) = hitPoint.m_data[1];
        *(double *)((long)pVVar18->m_data + lVar25) = hitPoint.m_data[2];
        pVVar18 = this->m_extraDistNormals;
        *(double *)((long)pVVar18->m_data + lVar25 + -0x10) = hitNormal.m_data[0];
        *(double *)((long)pVVar18->m_data + lVar25 + -8) = hitNormal.m_data[1];
        *(double *)((long)pVVar18->m_data + lVar25) = hitNormal.m_data[2];
        local_4f0.m_name = this->m_nPoints + lVar21;
        local_4f0.m_dist = 0.0;
        local_4f0.m_computed = false;
        local_4f0.m_distOnly = true;
        SArray<HACD::DPoint,_16UL>::PushBack
                  ((SArray<HACD::DPoint,_16UL> *)
                   ((long)(((this->m_graph).m_vertices.
                            super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                   lVar24 + -0x10),&local_4f0);
        uVar26 = this->m_nTriangles;
      }
      lVar21 = lVar21 + 1;
      auVar28 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar26);
      puVar20 = (undefined1 *)(((double)lVar21 * 100.0) / auVar28._0_8_);
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = (double)puVar20 - (double)local_580;
      auVar28 = vandpd_avx512vl(auVar40,auVar12);
      if ((1.0 < auVar28._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
        sprintf(msg,"%3.2f %% \t \t \r");
        (*this->m_callBack)(msg,(double)puVar20,0.0,this->m_nTriangles);
        local_580 = puVar20;
      }
      lVar25 = lVar25 + 0x18;
      lVar24 = lVar24 + 0x310;
    }
  }
  lVar25 = 0;
  for (uVar26 = 0; uVar26 < this->m_nPoints; uVar26 = uVar26 + 1) {
    Vec3<double>::Normalize((Vec3<double> *)((long)this->m_normals->m_data + lVar25));
    lVar25 = lVar25 + 0x18;
  }
  RaycastMesh::~RaycastMesh(&rm);
  return;
}

Assistant:

void HACD::InitializeDualGraph()
    {
        long i, j, k;
        Vec3<Real> u, v, w, normal;
		delete [] m_normals;
		m_normals = new Vec3<Real>[m_nPoints];
        if (m_addFacesPoints)
        {
            delete [] m_facePoints;
            delete [] m_faceNormals;
            
			m_facePoints = new Vec3<Real>[m_nTriangles];
            m_faceNormals = new Vec3<Real>[m_nTriangles];
/*
            m_facePoints = new Vec3<Real>[4*m_nTriangles];
            m_faceNormals = new Vec3<Real>[4*m_nTriangles];
*/
        }
		memset(m_normals, 0, sizeof(Vec3<Real>) * m_nPoints);

        RaycastMesh rm;
        if (m_addExtraDistPoints)
        {
            rm.Initialize(m_nPoints, m_nTriangles, m_points, m_triangles, 15);
            m_extraDistPoints = new Vec3<Real>[m_nTriangles];
            m_extraDistNormals = new Vec3<Real>[m_nTriangles];
        }
        double progressOld = -1.0;
        double progress = 0.0;
		char msg[1024];
		double ptgStep = 1.0;
		m_area = 0.0;				
		for(unsigned long f = 0; f < m_nTriangles; f++)
        {
            progress = f * 100.0 / m_nTriangles;
            if (fabs(progress-progressOld) > ptgStep && m_callBack)
            {
				sprintf(msg, "%3.2f %% \t \t \r", progress);
				(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
                progressOld = progress;
            }

			i = m_triangles[f].X();
            j = m_triangles[f].Y();
            k = m_triangles[f].Z();
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(i, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(j, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(k, 0, false, false));
            
            ICHUll  * ch = new ICHUll(m_heapManager);
            m_graph.m_vertices[f].m_convexHull = ch;
            ch->AddPoint(m_points[i], i);
            ch->AddPoint(m_points[j], j);
            ch->AddPoint(m_points[k], k);
			ch->SetDistPoints(0);

			u = m_points[j] - m_points[i];
			v = m_points[k] - m_points[i];
			w = m_points[k] - m_points[j];
			normal = u ^ v;

			m_normals[i] += normal;
			m_normals[j] += normal;
			m_normals[k] += normal;

			m_graph.m_vertices[f].m_surf = normal.GetNorm();
			m_area += m_graph.m_vertices[f].m_surf;
            normal.Normalize();
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(i,j));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(j,k));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(k,i));
            if(m_addFacesPoints)
            {
                m_faceNormals[f] = normal;
                m_facePoints[f] = (m_points[i] + m_points[j] + m_points[k]) / 3.0;
				m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(-static_cast<long>(f)-1, 0, false, true));
            }
        }

		// Now we have all the points in the KD tree, optimize the distance points insertion by running them in parallel
		// if possible. 
		if (m_addExtraDistPoints)	
        {
			if (m_callBack)
				(*m_callBack)("++ Also adding distance points\n", 0.0, 0.0, 0);

	        progressOld = -1.0;
			progress = 0.0;
			long completed = 0;

#ifdef THREAD_DIST_POINTS
#pragma omp parallel for
#endif
			for(long f = 0; f < (long)m_nTriangles; f++)
			{
				Vec3<Real> seedPoint((m_points[i] + m_points[j] + m_points[k]) / 3.0);
				Vec3<Real> hitPoint;
				Vec3<Real> hitNormal;
				normal = -normal;
                size_t faceIndex = m_nTriangles;

				Float dist;
				long hitTriangle;
				if (rm.Raycast(seedPoint,normal,hitTriangle,dist, hitPoint, hitNormal))
				{
					faceIndex = hitTriangle;
				}

                if (faceIndex < m_nTriangles )
                {
					m_extraDistPoints[f] = hitPoint;
					m_extraDistNormals[f] = hitNormal;
					m_graph.m_vertices[f].m_distPoints.PushBack(DPoint((long)(m_nPoints+f), 0, false, true));
				}

				// Atomic update of the progress
				#ifdef THREAD_DIST_POINTS
				#pragma omp critical
				#endif
				{
					completed++;
				
					progress = completed * 100.0 / m_nTriangles;
					if (fabs(progress-progressOld) > ptgStep && m_callBack)
					{
						sprintf(msg, "%3.2f %% \t \t \r", progress);
						(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
						progressOld = progress;
					}
				}        
			}
		}

        for (size_t v = 0; v < m_nPoints; v++) 
		{
			m_normals[v].Normalize();
		}
    }